

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivVerify.cpp
# Opt level: O0

void DivVerifyUint64Int16(void)

{
  bool bVar1;
  TestCase<unsigned_long,_short,_1> TVar2;
  uint64_t x;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  uint64_t ret;
  TestCase<unsigned_long,_short,_1> test;
  TestVector<unsigned_long,_short,_1> tests;
  allocator *in_stack_fffffffffffffed8;
  allocator *in_stack_fffffffffffffee0;
  TestVector<unsigned_long,_short,_1> *in_stack_fffffffffffffee8;
  TestVector<unsigned_long,_short,_1> *this;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffef0;
  unsigned_long local_100;
  short local_f8;
  bool bStack_f6;
  allocator local_d9;
  string local_d8 [40];
  unsigned_long local_b0;
  allocator local_a1;
  string local_a0 [5];
  undefined1 in_stack_ffffffffffffff65;
  short in_stack_ffffffffffffff66;
  unsigned_long in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  TestVector<unsigned_long,_short,_1> local_80;
  allocator local_61;
  string local_60 [40];
  TestCase<unsigned_long,_short,_1> local_38;
  unsigned_long local_28;
  short local_20;
  byte local_1e;
  TestVector<unsigned_long,_short,_1> local_18;
  
  TestVector<unsigned_long,_short,_1>::TestVector(&local_18);
  local_38 = TestVector<unsigned_long,_short,_1>::GetNext(in_stack_fffffffffffffee8);
  local_28 = local_38.x;
  local_20 = local_38.y;
  local_1e = local_38.fExpected;
  while( true ) {
    bVar1 = TestVector<unsigned_long,_short,_1>::Done(&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeDivide<unsigned_long,short>
                      ((unsigned_long)in_stack_fffffffffffffee0,
                       (short)((ulong)in_stack_fffffffffffffed8 >> 0x30),(unsigned_long *)0x19b286);
    if (bVar1 != (bool)(local_1e & 1)) {
      in_stack_fffffffffffffef0.m_int = (long)&local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_60,"Error in case uint64_int64: ",
                 (allocator *)in_stack_fffffffffffffef0.m_int);
      err_msg<unsigned_long,short>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff66,
                 (bool)in_stack_ffffffffffffff65);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
    }
    local_80.count._3_1_ = 1;
    this = &local_80;
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)this,&local_28);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator/=((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_fffffffffffffee0,(short)((ulong)in_stack_fffffffffffffed8 >> 0x30));
    if ((local_80.count._3_1_ & 1) != (local_1e & 1)) {
      in_stack_fffffffffffffee0 = &local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a0,"Error in case uint64_int32 throw: ",in_stack_fffffffffffffee0);
      err_msg<unsigned_long,short>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff66,
                 (bool)in_stack_ffffffffffffff65);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
    local_80.count._3_1_ = 1;
    local_b0 = local_28;
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<short>((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)in_stack_fffffffffffffee0,(short *)in_stack_fffffffffffffed8);
    operator/=((unsigned_long *)this,in_stack_fffffffffffffef0);
    if ((local_80.count._3_1_ & 1) != (local_1e & 1)) {
      in_stack_fffffffffffffed8 = &local_d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_d8,"Error in case uint64_int16 throw: ",in_stack_fffffffffffffed8);
      err_msg<unsigned_long,short>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff66,
                 (bool)in_stack_ffffffffffffff65);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    }
    TVar2 = TestVector<unsigned_long,_short,_1>::GetNext(this);
    local_100 = TVar2.x;
    local_f8 = TVar2.y;
    bStack_f6 = TVar2.fExpected;
    local_28 = local_100;
    local_20 = local_f8;
    local_1e = bStack_f6;
  }
  return;
}

Assistant:

void DivVerifyUint64Int16()
{
    TestVector< std::uint64_t, std::int16_t, OpType::Div > tests;
    TestCase< std::uint64_t, std::int16_t, OpType::Div > test = tests.GetNext();

    while (!tests.Done())
    {
      std::uint64_t ret;
      if( SafeDivide(test.x, test.y, ret) != test.fExpected )
      {
         //assert(false);
          err_msg( "Error in case uint64_int64: ", test.x, test.y, test.fExpected );
      }

      // Now test throwing version
      bool fSuccess = true;
      try
      {
         SafeInt<std::uint64_t> si(test.x);
         si /= test.y;
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
          err_msg( "Error in case uint64_int32 throw: ", test.x, test.y, test.fExpected );
      }

      // Also need to test the version that assigns back out
      // to a plain int, as it has different logic
      fSuccess = true;
      try
      {
         std::uint64_t x(test.x);
         x /= SafeInt<std::int64_t>(test.y);
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
          err_msg( "Error in case uint64_int16 throw: ", test.x, test.y, test.fExpected );
      }

      test = tests.GetNext();
   }
}